

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2cdev.cpp
# Opt level: O1

bool __thiscall I2Cdev::writeBytes(I2Cdev *this,uint16_t regAddr,uint8_t length,uint8_t *data)

{
  uint __fd;
  int iVar1;
  undefined7 in_register_00000011;
  i2c_rdwr_ioctl_data msgset;
  i2c_msg msgs [2];
  uint8_t buf [128];
  undefined1 local_a6 [126];
  
  if (length < 0x7f) {
    __fd = open(&(this->super_I2Cgeneric).field_0xd,2);
    if ((int)__fd < 0) {
      writeBytes();
    }
    else {
      iVar1 = ioctl(__fd,0x703,(ulong)(byte)(this->super_I2Cgeneric).field_0xc);
      if (iVar1 < 0) {
        writeBytes((I2Cdev *)(ulong)__fd);
      }
      else {
        memcpy(local_a6,data,(ulong)(uint)((int)CONCAT71(in_register_00000011,length) * 2));
        ioctl(__fd,0x707);
        close(__fd);
      }
    }
  }
  else {
    fprintf(_stderr,"Byte write count (%d) > 126\n",
            CONCAT71(in_register_00000011,length) & 0xffffffff);
  }
  return length < 0x7f;
}

Assistant:

bool I2Cdev::writeBytes(uint16_t regAddr, uint8_t length, uint8_t* data) {
    int8_t count = 0;
    uint8_t buf[128];

    if (length > 126) {
        fprintf(stderr, "Byte write count (%d) > 126\n", length);
        return(FALSE);
    }

    int fd = open(this->i2c_path, O_RDWR);

    if (fd < 0) {
        fprintf(stderr, "Failed to open device: %s\n", strerror(errno));
        return(-1);
    }
    if (ioctl(fd, I2C_SLAVE, this->address) < 0) {
        fprintf(stderr, "Failed to select device: %s\n", strerror(errno));
        close(fd);
        return(-1);
    }

    int err;
    buf[0] = (uint8_t)(regAddr >> 8);
    buf[1] = (uint8_t)(regAddr & 0xff);

    memcpy(buf+2, data, length*2);

    struct i2c_rdwr_ioctl_data msgset;
    struct i2c_msg msgs[2] = {
        {
            .addr = this->address,
            .flags = 0,
            .len = (uint8_t)(2 + length),
            .buf = buf,
        }
    };

    msgset.msgs = msgs;
    msgset.nmsgs = 1;

    err = ioctl(fd, I2C_RDWR, &msgset);
    close(fd);

    return TRUE;
}